

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

Expression * __thiscall wasm::DataFlow::Graph::getParent(Graph *this,Expression *curr)

{
  iterator iVar1;
  Expression *pEVar2;
  Expression *local_10;
  Expression *curr_local;
  
  local_10 = curr;
  iVar1 = std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->expressionParentMap)._M_h,&local_10);
  if (iVar1.super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    pEVar2 = (Expression *)0x0;
  }
  else {
    pEVar2 = *(Expression **)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false>
                     ._M_cur + 0x10);
  }
  return pEVar2;
}

Assistant:

Expression* getParent(Expression* curr) {
    auto iter = expressionParentMap.find(curr);
    if (iter == expressionParentMap.end()) {
      return nullptr;
    }
    return iter->second;
  }